

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_kGMAACluster.cpp
# Opt level: O1

void __thiscall GMAA_kGMAACluster::SaveClusterStats(GMAA_kGMAACluster *this,string *filename)

{
  ostream *poVar1;
  ofstream fp;
  string local_238;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"GMAA_kGMAACluster::SaveClusterStats failed to open file ",0x38
              );
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  SoftPrintClusteringStats_abi_cxx11_(&local_238,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_218,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void GMAA_kGMAACluster::SaveClusterStats(string filename) const
{
    ofstream fp(filename.c_str());
    if(!fp)
        cerr << "GMAA_kGMAACluster::SaveClusterStats failed to open file "
             << filename << endl;

    fp << SoftPrintClusteringStats() << endl;
}